

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void obmc_variance(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
                  int *sum)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar3;
  }
  if (h < 1) {
    h = 0;
  }
  uVar1 = 0;
  iVar6 = 0;
  for (; (int)uVar3 != h; uVar3 = (ulong)((int)uVar3 + 1)) {
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      iVar4 = wsrc[uVar7] - (uint)pre[uVar7] * mask[uVar7];
      if (iVar4 < 0) {
        uVar5 = -(0x800U - iVar4 >> 0xc);
      }
      else {
        uVar5 = iVar4 + 0x800U >> 0xc;
      }
      iVar6 = iVar6 + uVar5;
      uVar1 = uVar1 + uVar5 * uVar5;
    }
    pre = pre + pre_stride;
    mask = mask + (uint)w;
    wsrc = wsrc + (uint)w;
  }
  *sse = uVar1;
  *sum = iVar6;
  return;
}

Assistant:

static inline void obmc_variance(const uint8_t *pre, int pre_stride,
                                 const int32_t *wsrc, const int32_t *mask,
                                 int w, int h, unsigned int *sse, int *sum) {
  int i, j;
  unsigned int tsse = 0;
  int tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}